

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::structTypeCheck
          (TParseContext *this,TSourceLoc *param_1,TPublicType *publicType)

{
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  TTypeList *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar5;
  TSourceLoc *pTVar6;
  uint uVar7;
  ulong uVar8;
  TQualifier *this_00;
  
  pTVar4 = TType::getStruct(publicType->userDef);
  uVar7 = 0;
  while( true ) {
    uVar8 = (ulong)uVar7;
    pTVar1 = (pTVar4->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pTVar4->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 5) <= uVar8)
    break;
    iVar3 = (*(pTVar1[uVar8].type)->_vptr_TType[10])();
    this_00 = (TQualifier *)CONCAT44(extraout_var,iVar3);
    pTVar1 = (pTVar4->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar6 = &pTVar1[uVar8].loc;
    uVar5 = *(ulong *)&this_00->field_0x8;
    if ((uVar5 & 0x31e0e000007e) != 0) {
      iVar3 = (*(pTVar1[uVar8].type)->_vptr_TType[6])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar6,"cannot use storage or interpolation qualifiers on structure members",
                 *(undefined8 *)(CONCAT44(extraout_var_00,iVar3) + 8),"");
      uVar5 = *(ulong *)&this_00->field_0x8;
    }
    if ((uVar5 & 0x3ffc00000000000) != 0) {
      iVar3 = (*((pTVar4->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar8].type)->_vptr_TType[6])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar6,"cannot use memory qualifiers on structure members",
                 *(undefined8 *)(CONCAT44(extraout_var_01,iVar3) + 8),"");
    }
    bVar2 = TQualifier::hasLayout(this_00);
    if (bVar2) {
      iVar3 = (*((pTVar4->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar8].type)->_vptr_TType[6])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar6,"cannot use layout qualifiers on structure members",
                 *(undefined8 *)(CONCAT44(extraout_var_02,iVar3) + 8),"");
      TQualifier::clearLayout(this_00);
    }
    if ((this_00->field_0xb & 0x10) != 0) {
      iVar3 = (*((pTVar4->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar8].type)->_vptr_TType[6])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar6,"cannot use invariant qualifier on structure members",
                 *(undefined8 *)(CONCAT44(extraout_var_03,iVar3) + 8),"");
    }
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void TParseContext::structTypeCheck(const TSourceLoc& /*loc*/, TPublicType& publicType)
{
    const TTypeList& typeList = *publicType.userDef->getStruct();

    // fix and check for member storage qualifiers and types that don't belong within a structure
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.isAuxiliary() ||
            memberQualifier.isInterpolation() ||
            (memberQualifier.storage != EvqTemporary && memberQualifier.storage != EvqGlobal))
            error(memberLoc, "cannot use storage or interpolation qualifiers on structure members", typeList[member].type->getFieldName().c_str(), "");
        if (memberQualifier.isMemory())
            error(memberLoc, "cannot use memory qualifiers on structure members", typeList[member].type->getFieldName().c_str(), "");
        if (memberQualifier.hasLayout()) {
            error(memberLoc, "cannot use layout qualifiers on structure members", typeList[member].type->getFieldName().c_str(), "");
            memberQualifier.clearLayout();
        }
        if (memberQualifier.invariant)
            error(memberLoc, "cannot use invariant qualifier on structure members", typeList[member].type->getFieldName().c_str(), "");
    }
}